

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_c.h
# Opt level: O3

T * __thiscall
dlib::
sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
::element(sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>
          *this)

{
  int iVar1;
  ostream *poVar2;
  fatal_error *this_00;
  ostringstream dlib_o_out;
  string local_1b0;
  undefined1 local_190 [376];
  
  iVar1 = (*(this->
            super_sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ).
            super_enumerable<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>_>
            ._vptr_enumerable[4])();
  if ((char)iVar1 != '\0') {
    return &((this->
             super_sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             ).current_enumeration_node)->item;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,0xcb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../image_transforms/../statistics/../optimization/../sequence/sequence_kernel_c.h"
             ,0xaa);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "virtual const typename seq_base::type &dlib::sequence_kernel_c<dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button>>>::element() const [seq_base = dlib::sequence_kernel_2<std::unique_ptr<dlib::toggle_button>>]"
             ,0xd9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"this->current_element_valid() == true",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
       *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\tconst T& sequence::element() const",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\tyou can\'t access the current element if it doesn\'t exist",
             0x3a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n\tthis: ",8);
  poVar2 = std::ostream::_M_insert<void_const*>(local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

const typename seq_base::type& sequence_kernel_c<seq_base>::
    element (
    ) const
    {
        DLIB_CASSERT(this->current_element_valid() == true,
                "\tconst T& sequence::element() const"
                << "\n\tyou can't access the current element if it doesn't exist"
                << "\n\tthis: " << this
        );

        return seq_base::element();
    }